

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bgpsec.c
# Opt level: O1

rtr_signature_seg * rtr_bgpsec_new_signature_seg(uint8_t *ski,uint16_t sig_len,uint8_t *signature)

{
  long lVar1;
  undefined8 uVar2;
  rtr_signature_seg *ptr;
  uint8_t *puVar3;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  ptr = (rtr_signature_seg *)lrtr_malloc(0x28);
  if (ptr != (rtr_signature_seg *)0x0) {
    puVar3 = (uint8_t *)lrtr_calloc((ulong)sig_len,1);
    ptr->signature = puVar3;
    if (puVar3 != (uint8_t *)0x0) {
      puVar3 = ptr->ski;
      if (ski == (uint8_t *)0x0) {
        puVar3[0] = '\0';
        puVar3[1] = '\0';
        puVar3[2] = '\0';
        puVar3[3] = '\0';
        puVar3[4] = '\0';
        puVar3[5] = '\0';
        puVar3[6] = '\0';
        puVar3[7] = '\0';
        ptr->ski[8] = '\0';
        ptr->ski[9] = '\0';
        ptr->ski[10] = '\0';
        ptr->ski[0xb] = '\0';
        ptr->ski[0xc] = '\0';
        ptr->ski[0xd] = '\0';
        ptr->ski[0xe] = '\0';
        ptr->ski[0xf] = '\0';
        ptr->ski[0x10] = '\0';
        ptr->ski[0x11] = '\0';
        ptr->ski[0x12] = '\0';
        ptr->ski[0x13] = '\0';
      }
      else {
        *(undefined4 *)(ptr->ski + 0x10) = *(undefined4 *)(ski + 0x10);
        uVar2 = *(undefined8 *)(ski + 8);
        *(undefined8 *)puVar3 = *(undefined8 *)ski;
        *(undefined8 *)(ptr->ski + 8) = uVar2;
      }
      if (signature != (uint8_t *)0x0) {
        memcpy(ptr->signature,signature,(ulong)sig_len);
      }
      ptr->sig_len = sig_len;
      ptr->next = (rtr_signature_seg *)0x0;
      goto LAB_001115a3;
    }
    lrtr_free(ptr);
  }
  ptr = (rtr_signature_seg *)0x0;
LAB_001115a3:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return ptr;
  }
  __stack_chk_fail();
}

Assistant:

struct rtr_signature_seg *rtr_bgpsec_new_signature_seg(uint8_t *ski, uint16_t sig_len, uint8_t *signature)
{
	struct rtr_signature_seg *sig_seg = lrtr_malloc(sizeof(struct rtr_signature_seg));

	if (!sig_seg)
		return NULL;

	sig_seg->signature = lrtr_calloc(sig_len, 1);
	if (!sig_seg->signature) {
		lrtr_free(sig_seg);
		return NULL;
	}

	if (ski)
		memcpy(sig_seg->ski, ski, SKI_SIZE);
	else
		memset(sig_seg->ski, '\0', SKI_SIZE);

	if (signature)
		memcpy(sig_seg->signature, signature, sig_len);

	sig_seg->sig_len = sig_len;
	sig_seg->next = NULL;
	return sig_seg;
}